

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

string * getBoundType_abi_cxx11_(string *__return_storage_ptr__,double lower,double upper)

{
  bool bVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = highs_isInfinity(-lower);
  if (bVar1) {
    bVar1 = highs_isInfinity(upper);
    pcVar2 = "UB";
    if (bVar1) {
      pcVar2 = "FR";
    }
  }
  else {
    bVar1 = highs_isInfinity(upper);
    if (bVar1) {
      pcVar2 = "LB";
    }
    else {
      pcVar2 = "FX";
      if (lower < upper) {
        pcVar2 = "BX";
      }
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar2);
  return __return_storage_ptr__;
}

Assistant:

static std::string getBoundType(const double lower, const double upper) {
  std::string type;
  if (highs_isInfinity(-lower)) {
    if (highs_isInfinity(upper)) {
      type = "FR";
    } else {
      type = "UB";
    }
  } else {
    if (highs_isInfinity(upper)) {
      type = "LB";
    } else {
      if (lower < upper) {
        type = "BX";
      } else {
        type = "FX";
      }
    }
  }
  return type;
}